

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall
c4::yml::Parser::_location_from_node(Parser *this,Tree *tree,size_t node,Location *loc,size_t level)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  code *pcVar4;
  Location LVar5;
  undefined1 auVar6 [24];
  Location LVar7;
  Location LVar8;
  Location LVar9;
  bool bVar10;
  undefined1 uVar11;
  csubstr *pcVar12;
  NodeType NVar13;
  size_t sVar14;
  char msg [32];
  Location local_108;
  Location *local_e0;
  size_t local_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_e0 = loc;
  local_d8 = level;
  if ((node == 0xffffffffffffffff) || (tree->m_cap <= node)) {
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      uVar11 = (*pcVar4)();
      return (bool)uVar11;
    }
    local_108.super_LineCol.offset = 0;
    local_108.super_LineCol.line = 0x4b86;
    local_108.super_LineCol.col = 0;
    local_108.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_108.name.len = 0x65;
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((tree->m_buf[node].m_type.type & KEY) != NOTYPE) {
    pcVar12 = Tree::key(tree,node);
    pcVar1 = pcVar12->str;
    if (pcVar1 != (char *)0x0) {
      sVar14 = pcVar12->len;
      pcVar2 = (this->m_buf).str;
      sVar3 = (this->m_buf).len;
      if (sVar3 == 0) {
        if (sVar14 == 0) {
          bVar10 = pcVar2 == pcVar1;
          goto LAB_001e9979;
        }
LAB_001e9981:
        local_108.super_LineCol.col._0_1_ = '.';
        local_108.super_LineCol.col._1_1_ = 'i';
        local_108.super_LineCol.col._2_1_ = 's';
        local_108.super_LineCol.col._3_1_ = '_';
        local_108.super_LineCol.col._4_1_ = 's';
        local_108.super_LineCol.col._5_1_ = 'u';
        local_108.super_LineCol.col._6_1_ = 'b';
        local_108.super_LineCol.col._7_1_ = '(';
        local_108.name.str = (char *)0x29296675625f6d;
        local_108.super_LineCol.offset._0_1_ = 'c';
        local_108.super_LineCol.offset._1_1_ = 'h';
        local_108.super_LineCol.offset._2_1_ = 'e';
        local_108.super_LineCol.offset._3_1_ = 'c';
        local_108.super_LineCol.offset._4_1_ = 'k';
        local_108.super_LineCol.offset._5_1_ = ' ';
        local_108.super_LineCol.offset._6_1_ = 'f';
        local_108.super_LineCol.offset._7_1_ = 'a';
        local_108.super_LineCol.line._0_1_ = 'i';
        local_108.super_LineCol.line._1_1_ = 'l';
        local_108.super_LineCol.line._2_1_ = 'e';
        local_108.super_LineCol.line._3_1_ = 'd';
        local_108.super_LineCol.line._4_1_ = ':';
        local_108.super_LineCol.line._5_1_ = ' ';
        local_108.super_LineCol.line._6_1_ = '(';
        local_108.super_LineCol.line._7_1_ = 'k';
        if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar4 = (code *)swi(3);
          uVar11 = (*pcVar4)();
          return (bool)uVar11;
        }
        local_58 = 0;
        uStack_50 = 0x7fa8;
        local_48 = 0;
        pcStack_40 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_38 = 0x65;
        auVar6 = ZEXT1224(ZEXT412(0x7fa8) << 0x40);
        LVar5.name.str._0_4_ = 0x1fdf9a;
        LVar5.super_LineCol.offset = auVar6._0_8_;
        LVar5.super_LineCol.line = auVar6._8_8_;
        LVar5.super_LineCol.col = auVar6._16_8_;
        LVar5.name.str._4_4_ = 0;
        LVar5.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_108,0x20,LVar5,(this->m_stack).m_callbacks.m_user_data);
      }
      else {
        bVar10 = pcVar1 + sVar14 <= pcVar2 + sVar3 && pcVar2 <= pcVar1;
LAB_001e9979:
        if (!bVar10) goto LAB_001e9981;
      }
      sVar3 = (this->m_buf).len;
      if (sVar3 == 0) {
        if (sVar14 == 0) {
          bVar10 = (this->m_buf).str == pcVar1;
          goto LAB_001e9a4a;
        }
LAB_001e9a52:
        local_108.super_LineCol.col._0_1_ = '_';
        local_108.super_LineCol.col._1_1_ = 'b';
        local_108.super_LineCol.col._2_1_ = 'u';
        local_108.super_LineCol.col._3_1_ = 'f';
        local_108.super_LineCol.col._4_1_ = '.';
        local_108.super_LineCol.col._5_1_ = 'i';
        local_108.super_LineCol.col._6_1_ = 's';
        local_108.super_LineCol.col._7_1_ = '_';
        local_108.name.str = (char *)0x296b287265707573;
        local_108.super_LineCol.offset._0_1_ = 'c';
        local_108.super_LineCol.offset._1_1_ = 'h';
        local_108.super_LineCol.offset._2_1_ = 'e';
        local_108.super_LineCol.offset._3_1_ = 'c';
        local_108.super_LineCol.offset._4_1_ = 'k';
        local_108.super_LineCol.offset._5_1_ = ' ';
        local_108.super_LineCol.offset._6_1_ = 'f';
        local_108.super_LineCol.offset._7_1_ = 'a';
        local_108.super_LineCol.line._0_1_ = 'i';
        local_108.super_LineCol.line._1_1_ = 'l';
        local_108.super_LineCol.line._2_1_ = 'e';
        local_108.super_LineCol.line._3_1_ = 'd';
        local_108.super_LineCol.line._4_1_ = ':';
        local_108.super_LineCol.line._5_1_ = ' ';
        local_108.super_LineCol.line._6_1_ = '(';
        local_108.super_LineCol.line._7_1_ = 'm';
        local_108.name.len = CONCAT62(local_108.name.len._2_6_,0x29);
        if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar4 = (code *)swi(3);
          uVar11 = (*pcVar4)();
          return (bool)uVar11;
        }
        local_80 = 0;
        uStack_78 = 0x7fa9;
        local_70 = 0;
        pcStack_68 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_60 = 0x65;
        auVar6 = ZEXT1224(ZEXT412(0x7fa9) << 0x40);
        LVar7.name.str._0_4_ = 0x1fdf9a;
        LVar7.super_LineCol.offset = auVar6._0_8_;
        LVar7.super_LineCol.line = auVar6._8_8_;
        LVar7.super_LineCol.col = auVar6._16_8_;
        LVar7.name.str._4_4_ = 0;
        LVar7.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  ((char *)&local_108,0x22,LVar7,(this->m_stack).m_callbacks.m_user_data);
      }
      else {
        pcVar2 = (this->m_buf).str;
        bVar10 = pcVar1 + sVar14 <= pcVar2 + sVar3 && pcVar2 <= pcVar1;
LAB_001e9a4a:
        if (!bVar10) goto LAB_001e9a52;
      }
      val_location(&local_108,this,pcVar1);
      (local_e0->name).len = local_108.name.len;
      (local_e0->super_LineCol).col = local_108.super_LineCol.col;
      (local_e0->name).str = local_108.name.str;
      (local_e0->super_LineCol).offset = local_108.super_LineCol.offset;
      (local_e0->super_LineCol).line = local_108.super_LineCol.line;
      if (pcVar1 != (char *)0x0) {
        return true;
      }
    }
  }
  if ((node == 0xffffffffffffffff) || (tree->m_cap <= node)) {
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      uVar11 = (*pcVar4)();
      return (bool)uVar11;
    }
    local_108.super_LineCol.offset = 0;
    local_108.super_LineCol.line = 0x4b86;
    local_108.super_LineCol.col = 0;
    local_108.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_108.name.len = 0x65;
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((tree->m_buf[node].m_type.type & VAL) == NOTYPE) goto LAB_001e9db9;
  pcVar12 = Tree::val(tree,node);
  pcVar1 = pcVar12->str;
  if (pcVar1 == (char *)0x0) goto LAB_001e9db9;
  sVar14 = pcVar12->len;
  pcVar2 = (this->m_buf).str;
  sVar3 = (this->m_buf).len;
  if (sVar3 == 0) {
    if (sVar14 == 0) {
      bVar10 = pcVar2 == pcVar1;
      goto LAB_001e9c08;
    }
LAB_001e9c10:
    local_108.super_LineCol.col._0_1_ = '.';
    local_108.super_LineCol.col._1_1_ = 'i';
    local_108.super_LineCol.col._2_1_ = 's';
    local_108.super_LineCol.col._3_1_ = '_';
    local_108.super_LineCol.col._4_1_ = 's';
    local_108.super_LineCol.col._5_1_ = 'u';
    local_108.super_LineCol.col._6_1_ = 'b';
    local_108.super_LineCol.col._7_1_ = '(';
    local_108.name.str = (char *)0x29296675625f6d;
    local_108.super_LineCol.offset._0_1_ = 'c';
    local_108.super_LineCol.offset._1_1_ = 'h';
    local_108.super_LineCol.offset._2_1_ = 'e';
    local_108.super_LineCol.offset._3_1_ = 'c';
    local_108.super_LineCol.offset._4_1_ = 'k';
    local_108.super_LineCol.offset._5_1_ = ' ';
    local_108.super_LineCol.offset._6_1_ = 'f';
    local_108.super_LineCol.offset._7_1_ = 'a';
    local_108.super_LineCol.line._0_1_ = 'i';
    local_108.super_LineCol.line._1_1_ = 'l';
    local_108.super_LineCol.line._2_1_ = 'e';
    local_108.super_LineCol.line._3_1_ = 'd';
    local_108.super_LineCol.line._4_1_ = ':';
    local_108.super_LineCol.line._5_1_ = ' ';
    local_108.super_LineCol.line._6_1_ = '(';
    local_108.super_LineCol.line._7_1_ = 'v';
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      uVar11 = (*pcVar4)();
      return (bool)uVar11;
    }
    local_a8 = 0;
    uStack_a0 = 0x7fb4;
    local_98 = 0;
    pcStack_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_88 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x7fb4) << 0x40);
    LVar8.name.str._0_4_ = 0x1fdf9a;
    LVar8.super_LineCol.offset = auVar6._0_8_;
    LVar8.super_LineCol.line = auVar6._8_8_;
    LVar8.super_LineCol.col = auVar6._16_8_;
    LVar8.name.str._4_4_ = 0;
    LVar8.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_108,0x20,LVar8,(this->m_stack).m_callbacks.m_user_data);
  }
  else {
    bVar10 = pcVar1 + sVar14 <= pcVar2 + sVar3 && pcVar2 <= pcVar1;
LAB_001e9c08:
    if (!bVar10) goto LAB_001e9c10;
  }
  sVar3 = (this->m_buf).len;
  if (sVar3 == 0) {
    if (sVar14 == 0) {
      bVar10 = (this->m_buf).str == pcVar1;
      goto LAB_001e9cd9;
    }
LAB_001e9ce1:
    local_108.super_LineCol.col._0_1_ = '_';
    local_108.super_LineCol.col._1_1_ = 'b';
    local_108.super_LineCol.col._2_1_ = 'u';
    local_108.super_LineCol.col._3_1_ = 'f';
    local_108.super_LineCol.col._4_1_ = '.';
    local_108.super_LineCol.col._5_1_ = 'i';
    local_108.super_LineCol.col._6_1_ = 's';
    local_108.super_LineCol.col._7_1_ = '_';
    local_108.name.str = (char *)0x2976287265707573;
    local_108.super_LineCol.offset._0_1_ = 'c';
    local_108.super_LineCol.offset._1_1_ = 'h';
    local_108.super_LineCol.offset._2_1_ = 'e';
    local_108.super_LineCol.offset._3_1_ = 'c';
    local_108.super_LineCol.offset._4_1_ = 'k';
    local_108.super_LineCol.offset._5_1_ = ' ';
    local_108.super_LineCol.offset._6_1_ = 'f';
    local_108.super_LineCol.offset._7_1_ = 'a';
    local_108.super_LineCol.line._0_1_ = 'i';
    local_108.super_LineCol.line._1_1_ = 'l';
    local_108.super_LineCol.line._2_1_ = 'e';
    local_108.super_LineCol.line._3_1_ = 'd';
    local_108.super_LineCol.line._4_1_ = ':';
    local_108.super_LineCol.line._5_1_ = ' ';
    local_108.super_LineCol.line._6_1_ = '(';
    local_108.super_LineCol.line._7_1_ = 'm';
    local_108.name.len = CONCAT62(local_108.name.len._2_6_,0x29);
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      uVar11 = (*pcVar4)();
      return (bool)uVar11;
    }
    local_d0 = 0;
    uStack_c8 = 0x7fb5;
    local_c0 = 0;
    pcStack_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_b0 = 0x65;
    auVar6 = ZEXT1224(ZEXT412(0x7fb5) << 0x40);
    LVar9.name.str._0_4_ = 0x1fdf9a;
    LVar9.super_LineCol.offset = auVar6._0_8_;
    LVar9.super_LineCol.line = auVar6._8_8_;
    LVar9.super_LineCol.col = auVar6._16_8_;
    LVar9.name.str._4_4_ = 0;
    LVar9.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_108,0x22,LVar9,(this->m_stack).m_callbacks.m_user_data);
  }
  else {
    pcVar2 = (this->m_buf).str;
    bVar10 = pcVar1 + sVar14 <= pcVar2 + sVar3 && pcVar2 <= pcVar1;
LAB_001e9cd9:
    if (!bVar10) goto LAB_001e9ce1;
  }
  val_location(&local_108,this,pcVar1);
  (local_e0->name).len = local_108.name.len;
  (local_e0->super_LineCol).col = local_108.super_LineCol.col;
  (local_e0->name).str = local_108.name.str;
  (local_e0->super_LineCol).offset = local_108.super_LineCol.offset;
  (local_e0->super_LineCol).line = local_108.super_LineCol.line;
  if (pcVar1 != (char *)0x0) {
    return true;
  }
LAB_001e9db9:
  if ((node == 0xffffffffffffffff) || (tree->m_cap <= node)) {
    if (((s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar4 = (code *)swi(3);
      uVar11 = (*pcVar4)();
      return (bool)uVar11;
    }
    local_108.super_LineCol.offset = 0;
    local_108.super_LineCol.line = 0x4b86;
    local_108.super_LineCol.col = 0;
    local_108.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_108.name.len = 0x65;
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((tree->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) {
    NVar13 = Tree::type(tree,node);
    bVar10 = false;
    if ((local_d8 == 0) && (NVar13.type != NOTYPE)) {
      sVar14 = Tree::prev_sibling(tree,node);
      if ((sVar14 != 0xffffffffffffffff) &&
         (bVar10 = _location_from_node(this,tree,sVar14,local_e0,1), bVar10)) {
        return true;
      }
      sVar14 = Tree::next_sibling(tree,node);
      if ((sVar14 != 0xffffffffffffffff) &&
         (bVar10 = _location_from_node(this,tree,sVar14,local_e0,1), bVar10)) {
        return true;
      }
      sVar14 = Tree::parent(tree,node);
      if ((sVar14 != 0xffffffffffffffff) &&
         (bVar10 = _location_from_node(this,tree,sVar14,local_e0,1), bVar10)) {
        return true;
      }
      bVar10 = false;
    }
  }
  else {
    _location_from_cont(this,tree,node,local_e0);
    bVar10 = true;
  }
  return bVar10;
}

Assistant:

bool Parser::_location_from_node(Tree const& tree, size_t node, Location *C4_RESTRICT loc, size_t level) const
{
    if(tree.has_key(node))
    {
        csubstr k = tree.key(node);
        if(C4_LIKELY(k.str != nullptr))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, k.is_sub(m_buf));
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(k));
            *loc = val_location(k.str);
            return true;
        }
    }

    if(tree.has_val(node))
    {
        csubstr v = tree.val(node);
        if(C4_LIKELY(v.str != nullptr))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, v.is_sub(m_buf));
            _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.is_super(v));
            *loc = val_location(v.str);
            return true;
        }
    }

    if(tree.is_container(node))
    {
        if(_location_from_cont(tree, node, loc))
            return true;
    }

    if(tree.type(node) != NOTYPE && level == 0)
    {
        // try the prev sibling
        {
            const size_t prev = tree.prev_sibling(node);
            if(prev != NONE)
            {
                if(_location_from_node(tree, prev, loc, level+1))
                    return true;
            }
        }
        // try the next sibling
        {
            const size_t next = tree.next_sibling(node);
            if(next != NONE)
            {
                if(_location_from_node(tree, next, loc, level+1))
                    return true;
            }
        }
        // try the parent
        {
            const size_t parent = tree.parent(node);
            if(parent != NONE)
            {
                if(_location_from_node(tree, parent, loc, level+1))
                    return true;
            }
        }
    }

    return false;
}